

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

int __thiscall
CTextRender::LoadFontCollection(CTextRender *this,void *pFilename,void *pBuf,long FileSize)

{
  FT_Long FVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int NumFaces;
  FT_Face_conflict FtFace;
  uint local_40;
  int local_14;
  FT_Face_conflict local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = FT_New_Memory_Face(*(undefined8 *)(in_RDI + 0xd0),in_RDX,in_RCX,0xffffffffffffffff,
                             &local_10);
  if (iVar2 == 0) {
    FVar1 = local_10->num_faces;
    FT_Done_Face(local_10);
    for (local_40 = 0; (int)local_40 < (int)FVar1; local_40 = local_40 + 1) {
      iVar2 = FT_New_Memory_Face(*(undefined8 *)(in_RDI + 0xd0),in_RDX,in_RCX,(long)(int)local_40,
                                 &local_10);
      if (iVar2 != 0) {
        FT_Done_Face(local_10);
        break;
      }
      iVar2 = CGlyphMap::AddFace(*(CGlyphMap **)(in_RDI + 0x38),local_10);
      if (iVar2 != 0) {
        FT_Done_Face(local_10);
        break;
      }
    }
    dbg_msg("textrender","loaded %d faces from font file \'%s\'",(ulong)local_40,in_RSI);
    local_14 = 0;
  }
  else {
    local_14 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int CTextRender::LoadFontCollection(const void *pFilename, const void *pBuf, long FileSize)
{
	FT_Face FtFace;

	if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, -1, &FtFace))
		return -1;

	int NumFaces = FtFace->num_faces;
	FT_Done_Face(FtFace);

	int i;
	for(i = 0; i < NumFaces; ++i)
	{
		if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, i, &FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}

		if(m_pGlyphMap->AddFace(FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}
	}

	dbg_msg("textrender", "loaded %d faces from font file '%s'", i, (char *)pFilename);

	return 0;
}